

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChakraRtInterface.cpp
# Opt level: O3

HRESULT ChakraRTInterface::OnChakraCoreLoaded(TestHooks *testHooks)

{
  HRESULT HVar1;
  
  if (m_testHooksInitialized) {
    return 0;
  }
  memcpy(&m_testHooks,testHooks,0x2a50);
  m_testHooksSetup = true;
  m_testHooksInitialized = true;
  HVar1 = ParseConfigFlags();
  return HVar1;
}

Assistant:

HRESULT ChakraRTInterface::OnChakraCoreLoaded(TestHooks& testHooks)
{
    if (!m_testHooksInitialized)
    {
        m_testHooks = testHooks;
        m_testHooksSetup = true;
        m_testHooksInitialized = true;
        return ParseConfigFlags();
    }

    return S_OK;
}